

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

void V_DrawFrame(int left,int top,int width,int height)

{
  DFrameBuffer *pDVar1;
  FTexture *pFVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double x;
  double y;
  
  uVar3 = (uint)gameinfo.Border.offset;
  uVar5 = width + left;
  uVar4 = height + top;
  pFVar2 = FTextureManager::operator[](&TexMan,gameinfo.Border.t.Chars);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (screen,(ulong)(uint)left,(ulong)(top - (uint)pFVar2->Height),(ulong)uVar5,
             (ulong)(uint)top,pFVar2,1);
  pFVar2 = FTextureManager::operator[](&TexMan,gameinfo.Border.b.Chars);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (screen,(ulong)(uint)left,(ulong)uVar4,(ulong)uVar5,(ulong)(pFVar2->Height + uVar4),
             pFVar2,1);
  pFVar2 = FTextureManager::operator[](&TexMan,gameinfo.Border.l.Chars);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (screen,(ulong)(left - (uint)pFVar2->Width),(ulong)(uint)top,(ulong)(uint)left,
             (ulong)uVar4,pFVar2,1);
  pFVar2 = FTextureManager::operator[](&TexMan,gameinfo.Border.r.Chars);
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
            (screen,(ulong)uVar5,(ulong)(uint)top,(ulong)(pFVar2->Width + uVar5),(ulong)uVar4,pFVar2
             ,1);
  pDVar1 = screen;
  pFVar2 = FTextureManager::operator[](&TexMan,gameinfo.Border.tl.Chars);
  x = (double)(int)(left - uVar3);
  y = (double)(int)(top - uVar3);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,x,y,0);
  pDVar1 = screen;
  pFVar2 = FTextureManager::operator[](&TexMan,gameinfo.Border.tr.Chars);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)(int)uVar5,y,0);
  pDVar1 = screen;
  pFVar2 = FTextureManager::operator[](&TexMan,gameinfo.Border.bl.Chars);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,x,(double)(int)uVar4,0);
  pDVar1 = screen;
  pFVar2 = FTextureManager::operator[](&TexMan,gameinfo.Border.br.Chars);
  DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar2,(double)(int)uVar5,(double)(int)uVar4,0);
  return;
}

Assistant:

void V_DrawFrame (int left, int top, int width, int height)
{
	FTexture *p;
	const gameborder_t *border = &gameinfo.Border;
	// Sanity check for incomplete gameinfo
	if (border == NULL)
		return;
	int offset = border->offset;
	int right = left + width;
	int bottom = top + height;

	// Draw top and bottom sides.
	p = TexMan[border->t];
	screen->FlatFill(left, top - p->GetHeight(), right, top, p, true);
	p = TexMan[border->b];
	screen->FlatFill(left, bottom, right, bottom + p->GetHeight(), p, true);

	// Draw left and right sides.
	p = TexMan[border->l];
	screen->FlatFill(left - p->GetWidth(), top, left, bottom, p, true);
	p = TexMan[border->r];
	screen->FlatFill(right, top, right + p->GetWidth(), bottom, p, true);

	// Draw beveled corners.
	screen->DrawTexture (TexMan[border->tl], left-offset, top-offset, TAG_DONE);
	screen->DrawTexture (TexMan[border->tr], left+width, top-offset, TAG_DONE);
	screen->DrawTexture (TexMan[border->bl], left-offset, top+height, TAG_DONE);
	screen->DrawTexture (TexMan[border->br], left+width, top+height, TAG_DONE);
}